

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O2

void __thiscall PathBuilder::add(PathBuilder *this,Point a,Point b)

{
  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *this_00;
  _Rb_tree_header *p_Var1;
  _Elt_pointer *ppPVar2;
  int iVar3;
  int iVar4;
  mapped_type mVar5;
  pointer pdVar6;
  Point PVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> *__first;
  const_iterator *__position;
  _Rb_tree_header *p_Var13;
  key_type *__x;
  _Elt_pointer pPVar14;
  deque<Point,std::allocator<Point>> *pdVar15;
  Point *pPVar16;
  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *this_01;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> *__last;
  pointer pdVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  Point a_local;
  Point b_local;
  _Base_ptr local_190;
  iterator local_178;
  _Deque_iterator<Point,_Point_&,_Point_*> local_158;
  _Deque_iterator<Point,_Point_&,_Point_*> local_138;
  const_iterator local_118;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_f8;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_d8;
  const_iterator local_b8;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_98;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_78;
  const_iterator local_58;
  
  __x = &a_local;
  this_00 = &this->backs;
  a_local = a;
  b_local = b;
  local_190 = (_Base_ptr)
              std::
              _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::find(&this_00->_M_t,&a_local);
  p_Var1 = &(this->backs)._M_t._M_impl.super__Rb_tree_header;
  iVar8 = std::
          _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
          ::find(&this_00->_M_t,&b_local);
  this_01 = &this->fronts;
  iVar9 = std::
          _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
          ::find(&this_01->_M_t,&a_local);
  p_Var13 = &(this->fronts)._M_t._M_impl.super__Rb_tree_header;
  iVar10 = std::
           _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
           ::find(&this_01->_M_t,&b_local);
  PVar7 = a_local;
  if (((_Rb_tree_header *)iVar8._M_node == p_Var1) && ((_Rb_tree_header *)iVar9._M_node == p_Var13))
  {
    bVar19 = false;
    bVar18 = false;
  }
  else {
    a_local = b_local;
    b_local = PVar7;
    local_190 = (_Base_ptr)
                std::
                _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                ::find(&this_00->_M_t,&a_local);
    iVar8 = std::
            _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
            ::find(&this_00->_M_t,&b_local);
    bVar18 = (_Rb_tree_header *)iVar8._M_node != p_Var1;
    iVar8 = std::
            _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
            ::find(&this_01->_M_t,&a_local);
    bVar19 = (_Rb_tree_header *)iVar8._M_node != p_Var13;
    iVar10 = std::
             _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
             ::find(&this_01->_M_t,&b_local);
  }
  if (ABS(a_local.x - b_local.x) < 1e-08) {
    if (ABS(a_local.y - b_local.y) < 1e-08) {
      return;
    }
  }
  if (((_Rb_tree_header *)local_190 == p_Var1 && (_Rb_tree_header *)iVar10._M_node == p_Var13) &&
      !bVar19) {
    std::
    vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
    ::emplace_back<>(&this->paths);
    std::deque<Point,_std::allocator<Point>_>::push_back
              ((this->paths).
               super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,&a_local);
    std::deque<Point,_std::allocator<Point>_>::push_back
              ((this->paths).
               super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,&b_local);
    pdVar17 = (this->paths).
              super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pdVar6 = (this->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_01,&a_local);
    *pmVar11 = (int)(((long)pdVar17 - (long)pdVar6) / 0x50) + -1;
    pdVar17 = (this->paths).
              super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pdVar6 = (this->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_00,&b_local);
    *pmVar11 = (int)(((long)pdVar17 - (long)pdVar6) / 0x50) + -1;
    return;
  }
  bVar20 = (_Rb_tree_header *)iVar10._M_node != p_Var13;
  bVar21 = (_Rb_tree_header *)local_190 == p_Var1;
  if (bVar20 && !bVar21) {
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_01,&b_local);
    iVar3 = *pmVar11;
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_00,&a_local);
    if ((!bVar19 && !bVar18) && iVar3 == *pmVar11) {
      pmVar11 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](this_00,&a_local);
      __x = &b_local;
      std::deque<Point,_std::allocator<Point>_>::push_back
                ((this->paths).
                 super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *pmVar11,__x);
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::erase(&this_00->_M_t,&a_local);
      goto LAB_00109b47;
    }
  }
  if (((_Rb_tree_header *)iVar10._M_node != p_Var13) || ((!bVar18 || bVar19) || bVar21)) {
    if (((_Rb_tree_header *)local_190 != p_Var1 || bVar18) || (!bVar19 || !bVar20)) {
      if (((!bVar20 || bVar21) || bVar19) || bVar18) {
        if (((_Rb_tree_header *)local_190 == p_Var1 && !bVar18) && (bVar20 && !bVar19)) {
          __x = &b_local;
          pmVar11 = std::
                    map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                    ::operator[](this_01,__x);
          std::deque<Point,_std::allocator<Point>_>::push_front
                    ((this->paths).
                     super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + *pmVar11,&a_local);
          pmVar11 = std::
                    map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                    ::operator[](this_01,__x);
          mVar5 = *pmVar11;
          pmVar11 = std::
                    map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                    ::operator[](this_01,&a_local);
          *pmVar11 = mVar5;
        }
        else {
          if ((bVar18 || bVar19) || ((_Rb_tree_header *)iVar10._M_node != p_Var13 || bVar21)) {
            if (bVar19) {
              std::operator<<((ostream *)&std::cerr,"fronts contains a\n");
              poVar12 = std::operator<<((ostream *)&std::cerr,"    fronts[");
              operator<<(poVar12,&a_local);
              poVar12 = std::operator<<(poVar12,"] == ");
              pmVar11 = std::
                        map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                        ::operator[](this_01,&a_local);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pmVar11);
              std::operator<<(poVar12,"\n");
            }
            if ((_Rb_tree_header *)iVar10._M_node != p_Var13) {
              std::operator<<((ostream *)&std::cerr,"fronts contains b\n");
              poVar12 = std::operator<<((ostream *)&std::cerr,"    fronts[");
              operator<<(poVar12,&b_local);
              poVar12 = std::operator<<(poVar12,"] == ");
              pmVar11 = std::
                        map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                        ::operator[](this_01,&b_local);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pmVar11);
              std::operator<<(poVar12,"\n");
            }
            if ((_Rb_tree_header *)local_190 != p_Var1) {
              std::operator<<((ostream *)&std::cerr,"backs contains a\n");
              poVar12 = std::operator<<((ostream *)&std::cerr,"    backs[");
              operator<<(poVar12,&a_local);
              poVar12 = std::operator<<(poVar12,"] == ");
              pmVar11 = std::
                        map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                        ::operator[](this_00,&a_local);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pmVar11);
              std::operator<<(poVar12,"\n");
            }
            if (bVar18) {
              std::operator<<((ostream *)&std::cerr,"backs contains b\n");
              poVar12 = std::operator<<((ostream *)&std::cerr,"    backs[");
              operator<<(poVar12,&b_local);
              poVar12 = std::operator<<(poVar12,"] == ");
              pmVar11 = std::
                        map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                        ::operator[](this_00,&b_local);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pmVar11);
              std::operator<<(poVar12,"\n");
            }
            poVar12 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,a_local.x);
            poVar12 = std::operator<<(poVar12,"\" y1=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,a_local.y);
            poVar12 = std::operator<<(poVar12,"\" x2=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,b_local.x);
            poVar12 = std::operator<<(poVar12,"\" y2=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,b_local.y);
            std::operator<<(poVar12,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />");
            poVar12 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,a_local.x + -10.0);
            poVar12 = std::operator<<(poVar12,"\" y1=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,a_local.y + -10.0);
            poVar12 = std::operator<<(poVar12,"\" x2=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,a_local.x + -20.0);
            poVar12 = std::operator<<(poVar12,"\" y2=\"");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,a_local.y + -20.0);
            std::operator<<(poVar12,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />");
            exit(0x20);
          }
          pmVar11 = std::
                    map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                    ::operator[](this_00,&a_local);
          std::deque<Point,_std::allocator<Point>_>::push_back
                    ((this->paths).
                     super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + *pmVar11,&b_local);
          pmVar11 = std::
                    map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                    ::operator[](this_00,&a_local);
          mVar5 = *pmVar11;
          pmVar11 = std::
                    map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                    ::operator[](this_00,&b_local);
          *pmVar11 = mVar5;
          this_01 = this_00;
        }
LAB_00109b47:
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::erase(&this_01->_M_t,__x);
        return;
      }
      pmVar11 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](this_00,&a_local);
      iVar3 = *pmVar11;
      pmVar11 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](this_01,&b_local);
      iVar4 = *pmVar11;
      pdVar6 = (this->paths).
               super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar15 = (deque<Point,std::allocator<Point>> *)(pdVar6 + iVar3);
      pdVar17 = pdVar6 + iVar4;
      pPVar16 = ((iterator *)
                ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                0x30))->_M_cur;
      if (pPVar16 ==
          *(_Elt_pointer *)
           ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38)) {
        pPVar16 = (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      pmVar11 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](this_00,pPVar16 + -1);
      *pmVar11 = iVar3;
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::erase(&this_01->_M_t,&a_local);
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::erase(&this_01->_M_t,&b_local);
      local_118._M_cur = *(_Elt_pointer *)(pdVar15 + 0x30);
      local_118._M_first = *(_Elt_pointer *)(pdVar15 + 0x38);
      local_118._M_last = *(_Elt_pointer *)(pdVar15 + 0x40);
      local_118._M_node = *(_Map_pointer *)(pdVar15 + 0x48);
      local_138._M_cur =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      local_138._M_first =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_138._M_last =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_138._M_node =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_start._M_node;
      local_158._M_cur =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
      local_158._M_first =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_first;
      local_158._M_last =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_last;
      local_158._M_node =
           (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_node;
      std::deque<Point,std::allocator<Point>>::
      insert<std::_Deque_iterator<Point,Point&,Point*>,void>
                (&local_178,pdVar15,&local_118,&local_138,&local_158);
      goto LAB_00109c4b;
    }
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_01,&a_local);
    iVar3 = *pmVar11;
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_01,&b_local);
    iVar4 = *pmVar11;
    pdVar6 = (this->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar17 = pdVar6 + iVar4;
    pPVar16 = ((iterator *)
              ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x30)
              )->_M_cur;
    if (pPVar16 ==
        *(_Elt_pointer *)
         ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38)) {
      pPVar16 = (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pdVar15 = (deque<Point,std::allocator<Point>> *)(pdVar6 + iVar3);
    std::
    _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
    ::erase(&this_00->_M_t,pPVar16 + -1);
    pPVar14 = (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (pPVar14 ==
        (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
        _M_finish._M_first) {
      pPVar14 = (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_01,pPVar14 + -1);
    *pmVar11 = iVar3;
    std::
    _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
    ::erase(&this_01->_M_t,&a_local);
    std::
    _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
    ::erase(&this_01->_M_t,&b_local);
    local_b8._M_cur = *(_Elt_pointer *)(pdVar15 + 0x10);
    local_b8._M_first = *(_Elt_pointer *)(pdVar15 + 0x18);
    local_b8._M_last = *(_Elt_pointer *)(pdVar15 + 0x20);
    local_b8._M_node = *(_Map_pointer *)(pdVar15 + 0x28);
    __position = &local_b8;
    local_d8.current._M_cur =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_cur;
    local_d8.current._M_first =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_first;
    __first = &local_d8;
    local_d8.current._M_last =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_last;
    local_d8.current._M_node =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_node;
    local_f8.current._M_cur =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_cur;
    local_f8.current._M_first =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    __last = &local_f8;
    local_f8.current._M_last =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_last;
    local_f8.current._M_node =
         (pdVar17->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_node;
  }
  else {
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_00,&a_local);
    iVar3 = *pmVar11;
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_00,&b_local);
    iVar4 = *pmVar11;
    pdVar6 = (this->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (deque<Point,std::allocator<Point>> *)(pdVar6 + iVar3);
    pdVar17 = pdVar6 + iVar4;
    std::
    _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
    ::erase(&this_01->_M_t,
            ((iterator *)
            ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x10))
            ->_M_cur);
    pmVar11 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](this_00,((iterator *)
                                   ((long)&pdVar6[iVar4].
                                           super__Deque_base<Point,_std::allocator<Point>_>._M_impl
                                   + 0x10))->_M_cur);
    *pmVar11 = iVar3;
    std::
    _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
    ::erase(&this_00->_M_t,&a_local);
    std::
    _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
    ::erase(&this_00->_M_t,&b_local);
    local_58._M_cur =
         ((iterator *)
         ((long)&pdVar6[iVar3].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x30))->
         _M_cur;
    local_58._M_first =
         *(_Elt_pointer *)
          ((long)&pdVar6[iVar3].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38);
    ppPVar2 = (_Elt_pointer *)
              ((long)&pdVar6[iVar3].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x40)
    ;
    local_58._M_last = *ppPVar2;
    local_58._M_node = (_Map_pointer)ppPVar2[1];
    __position = &local_58;
    local_78.current._M_cur =
         ((iterator *)
         ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x30))->
         _M_cur;
    local_78.current._M_first =
         *(_Elt_pointer *)
          ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38);
    __first = &local_78;
    ppPVar2 = (_Elt_pointer *)
              ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x40)
    ;
    local_78.current._M_last = *ppPVar2;
    local_78.current._M_node = (_Map_pointer)ppPVar2[1];
    local_98.current._M_cur =
         ((iterator *)
         ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x10))->
         _M_cur;
    local_98.current._M_first =
         *(_Elt_pointer *)
          ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x18);
    __last = &local_98;
    ppPVar2 = (_Elt_pointer *)
              ((long)&pdVar6[iVar4].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x20)
    ;
    local_98.current._M_last = *ppPVar2;
    local_98.current._M_node = (_Map_pointer)ppPVar2[1];
  }
  std::deque<Point,std::allocator<Point>>::
  insert<std::reverse_iterator<std::_Deque_iterator<Point,Point&,Point*>>,void>
            (&local_178,pdVar15,__position,__first,__last);
LAB_00109c4b:
  std::deque<Point,_std::allocator<Point>_>::clear(pdVar17);
  std::deque<Point,_std::allocator<Point>_>::_M_shrink_to_fit(pdVar17);
  return;
}

Assistant:

void PathBuilder::add(Point a, Point b) {
    using namespace std;
    auto backs_contains_a = backs.find(a) != backs.end();
    auto backs_contains_b = backs.find(b) != backs.end();
    auto fronts_contains_a = fronts.find(a) != fronts.end();
    auto fronts_contains_b = fronts.find(b) != fronts.end();

    if (fronts_contains_a || backs_contains_b) {
        swap(a, b);
        backs_contains_a = backs.find(a) != backs.end();
        backs_contains_b = backs.find(b) != backs.end();
        fronts_contains_a = fronts.find(a) != fronts.end();
        fronts_contains_b = fronts.find(b) != fronts.end();
    }

    if (a == b) {
        return;
    }

    if (!fronts_contains_b && !backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // add a new path
        paths.emplace_back();
        paths.back().push_back(a);
        paths.back().push_back(b);
        fronts[a] = paths.size()-1;
        backs[b] = paths.size()-1;
    } else if (fronts_contains_b && backs_contains_a && (fronts[b] == backs[a]) && !backs_contains_b && !fronts_contains_a) {
        // close a loop
        paths[backs[a]].push_back(b);

        backs.erase(a);
        fronts.erase(b);
    } else if (backs_contains_b && backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = backs[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        fronts.erase(back_path.front());
        backs[back_path.front()] = front_path_index;
        backs.erase(a);
        backs.erase(b);

        front_path.insert(front_path.end(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && fronts_contains_a && !backs_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = fronts[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs.erase(back_path.back());
        fronts[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.begin(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && backs_contains_a && !fronts_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.end(), back_path.begin(), back_path.end());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && !fronts_contains_a && !backs_contains_b && !backs_contains_a) {
        // prepend to an existing path
        paths[fronts[b]].push_front(a);
        fronts[a] = fronts[b];
        fronts.erase(b);
    } else if (backs_contains_a && !fronts_contains_b && !fronts_contains_a && !backs_contains_b) {
        // append to an existing path
        paths[backs[a]].push_back(b);
        backs[b] = backs[a];
        backs.erase(a);
    } else {
        if (fronts_contains_a) {
            cerr<<"fronts contains a\n";
            cerr<<"    fronts["<<a<<"] == "<<fronts[a]<<"\n";
        }
        if (fronts_contains_b) {
            cerr<<"fronts contains b\n";
            cerr<<"    fronts["<<b<<"] == "<<fronts[b]<<"\n";
        }
        if (backs_contains_a) {
            cerr<<"backs contains a\n";
            cerr<<"    backs["<<a<<"] == "<<backs[a]<<"\n";
        }
        if (backs_contains_b) {
            cerr<<"backs contains b\n";
            cerr<<"    backs["<<b<<"] == "<<backs[b]<<"\n";
        }
        cout<<"<line x1=\""<<a.x<<"\" y1=\""<<a.y<<"\" x2=\""<<b.x<<"\" y2=\""<<b.y<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />";
        cout<<"<line x1=\""<<a.x-10<<"\" y1=\""<<a.y-10<<"\" x2=\""<<a.x-20<<"\" y2=\""<<a.y-20<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />";
        exit(32);
    }
}